

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O0

void __thiscall MT32Emu::Part::setDataEntryMSB(Part *this,uchar midiDataEntryMSB)

{
  uchar midiDataEntryMSB_local;
  Part *this_local;
  
  if (((this->nrpn & 1U) == 0) && (this->rpn == 0)) {
    if (0x18 < midiDataEntryMSB) {
      midiDataEntryMSB = '\x18';
    }
    (this->patchTemp->patch).benderRange = midiDataEntryMSB;
    updatePitchBenderRange(this);
  }
  return;
}

Assistant:

void Part::setDataEntryMSB(unsigned char midiDataEntryMSB) {
	if (nrpn) {
		// The last RPN-related control change was for an NRPN,
		// which the real synths don't support.
		return;
	}
	if (rpn != 0) {
		// The RPN has been set to something other than 0,
		// which is the only RPN that these synths support
		return;
	}
	patchTemp->patch.benderRange = midiDataEntryMSB > 24 ? 24 : midiDataEntryMSB;
	updatePitchBenderRange();
}